

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEditPrivate::clearSection(QDateTimeEditPrivate *this,int index)

{
  QLineEdit *pQVar1;
  int pos;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pos = QLineEdit::cursorPosition((this->super_QAbstractSpinBoxPrivate).edit);
  pQVar1 = (this->super_QAbstractSpinBoxPrivate).edit;
  if (pQVar1 != (QLineEdit *)0x0) {
    QObject::blockSignals(SUB81(pQVar1,0));
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text(&local_58,(this->super_QAbstractSpinBoxPrivate).edit);
  iVar3 = (int)this + 0x3d8;
  iVar2 = QDateTimeParser::sectionPos(iVar3);
  if (iVar2 == -1) {
    clearSection();
  }
  else {
    iVar3 = QDateTimeParser::sectionSize(iVar3);
    local_78 = (QArrayData *)0x0;
    uStack_70 = 0;
    local_68 = 0;
    QString::fill((QChar)(char16_t)&local_78,0x20);
    QString::replace((longlong)&local_58,(long)iVar2,(QString *)(long)iVar3);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    QLineEdit::setText((this->super_QAbstractSpinBoxPrivate).edit,&local_58);
    QLineEdit::setCursorPosition((this->super_QAbstractSpinBoxPrivate).edit,pos);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar1 != (QLineEdit *)0x0) {
    QObject::blockSignals(SUB81(pQVar1,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEditPrivate::clearSection(int index)
{
    const auto space = u' ';
    int cursorPos = edit->cursorPosition();
    const QSignalBlocker blocker(edit);
    QString t = edit->text();
    const int pos = sectionPos(index);
    if (Q_UNLIKELY(pos == -1)) {
        qWarning("QDateTimeEdit: Internal error (%s:%d)", __FILE__, __LINE__);
        return;
    }
    const int size = sectionSize(index);
    t.replace(pos, size, QString().fill(space, size));
    edit->setText(t);
    edit->setCursorPosition(cursorPos);
    QDTEDEBUG << cursorPos;
}